

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O2

Vector<3> *
Omega_h::inertia::anon_unknown_0::get_center
          (Vector<3> *__return_storage_ptr__,CommPtr *comm,Reals *coords,Reals *masses,
          Real total_mass)

{
  double *this;
  double dVar1;
  Alloc *pAVar2;
  uint uVar3;
  Int i_1;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  string local_148;
  Write<signed_char> local_128;
  Write<double> weighted_coords;
  Write<double> local_f0;
  Write<double> local_e0;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_d0;
  Vector<3> result;
  Write<double> local_a0;
  type f;
  Vector<3> v;
  double adStack_48 [3];
  
  pAVar2 = (masses->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar6 = pAVar2->size;
  }
  else {
    sVar6 = (ulong)pAVar2 >> 3;
  }
  std::__cxx11::string::string((string *)&local_148,"",(allocator *)&result);
  uVar3 = (uint)(sVar6 >> 3);
  Write<double>::Write(&weighted_coords,uVar3 * 3,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  Write<double>::Write(&f.weighted_coords,&weighted_coords);
  Write<double>::Write(&f.masses.write_,&masses->write_);
  Write<double>::Write(&f.coords.write_,&coords->write_);
  Write<double>::Write((Write<double> *)&result,&f.weighted_coords);
  this = result.super_Few<double,_3>.array_ + 2;
  Write<double>::Write((Write<double> *)this,&f.masses.write_);
  Write<double>::Write(&local_a0,&f.coords.write_);
  if (0 < (int)uVar3) {
    entering_parallel = 1;
    Write<double>::Write((Write<signed_char> *)&local_148,(Write<signed_char> *)&result);
    Write<double>::Write((Write<signed_char> *)&local_148.field_2,(Write<signed_char> *)this);
    Write<double>::Write(&local_128,(Write<signed_char> *)&local_a0);
    entering_parallel = 0;
    for (uVar4 = 0; uVar4 != (uVar3 & 0x7fffffff); uVar4 = uVar4 + 1) {
      dVar1 = *(double *)(local_148.field_2._8_8_ + uVar4 * 8);
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        v.super_Few<double,_3>.array_[lVar5] =
             *(double *)((long)local_128.shared_alloc_.direct_ptr + lVar5 * 8);
      }
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        adStack_48[lVar5] = v.super_Few<double,_3>.array_[lVar5] * dVar1;
      }
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        *(double *)(local_148._M_string_length + lVar5 * 8) = adStack_48[lVar5];
      }
      local_128.shared_alloc_.direct_ptr = (void *)((long)local_128.shared_alloc_.direct_ptr + 0x18)
      ;
      local_148._M_string_length = local_148._M_string_length + 0x18;
    }
    (anonymous_namespace)::
    get_center(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,double)::
    $_0::~__0((__0 *)&local_148);
  }
  (anonymous_namespace)::
  get_center(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,double)::$_0
  ::~__0((__0 *)&result);
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d0,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
  Write<double>::Write(&local_f0,&weighted_coords);
  Read<double>::Read((Read<signed_char> *)&local_e0,&local_f0);
  repro_sum((CommPtr *)&local_d0,(Reals *)&local_e0,3,(Real *)&result);
  Write<double>::~Write(&local_e0);
  Write<double>::~Write(&local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
  local_148.field_2._M_allocated_capacity = (size_type)result.super_Few<double,_3>.array_[2];
  local_148._M_dataplus._M_p = (pointer)result.super_Few<double,_3>.array_[0];
  local_148._M_string_length = (size_type)result.super_Few<double,_3>.array_[1];
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    (__return_storage_ptr__->super_Few<double,_3>).array_[lVar5] =
         (double)(&local_148._M_dataplus)[lVar5]._M_p / total_mass;
  }
  (anonymous_namespace)::
  get_center(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,double)::$_0
  ::~__0((__0 *)&f);
  Write<double>::~Write(&weighted_coords);
  return __return_storage_ptr__;
}

Assistant:

Vector<3> get_center(
    CommPtr comm, Reals coords, Reals masses, Real total_mass) {
  auto n = masses.size();
  Write<Real> weighted_coords(n * 3);
  auto f = OMEGA_H_LAMBDA(LO i) {
    set_vector<3>(weighted_coords, i, masses[i] * get_vector<3>(coords, i));
  };
  parallel_for(n, f, "get_center");
  Vector<3> result;
  repro_sum(comm, Reals(weighted_coords), 3, &result[0]);
  return result / total_mass;
}